

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall cxx::ModelGrammar::ModelGrammar(ModelGrammar *this)

{
  undefined1 local_2c5c;
  bool_<false> local_2c5b;
  terminal<boost::spirit::tag::bool_> local_2c5a [2];
  terminal<boost::spirit::tag::bool_> *local_2c58;
  terminal<boost::spirit::tag::bool_> **local_2c50;
  char *local_2c48;
  char *local_2c40;
  TypeGrammar *local_2c38;
  char **local_2c30;
  undefined1 ***local_2c28;
  undefined8 **local_2c20;
  undefined1 *local_2c18;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_cxx::TypeGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_2c10;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_cxx::TypeGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>
  local_2c00;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_cxx::TypeGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_cxx::InitializerGrammar_&>,_2L>
  local_2bf0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_cxx::TypeGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_cxx::InitializerGrammar_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>
  local_2be0;
  undefined1 local_2bcc;
  bool_<false> local_2bcb;
  terminal<boost::spirit::tag::bool_> local_2bca [2];
  terminal<boost::spirit::tag::bool_> *local_2bc8;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_2bc0;
  bool_<false> local_2bab;
  terminal<boost::spirit::tag::bool_> local_2baa [2];
  terminal<boost::spirit::tag::bool_> *local_2ba8;
  terminal<boost::spirit::tag::bool_> **local_2ba0;
  char *local_2b98;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>_&,_cxx::TypeGrammar_&>,_2L>
  local_2b90;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>_&,_cxx::TypeGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>
  local_2b80;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>_&,_cxx::TypeGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>_>,_2L>
  local_2b70;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>_>,_2L>_&,_cxx::TypeGrammar_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::bool_,_boost::fusion::vector<bool>_>_>,_0L>_&>,_1L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>_>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_2b60;
  expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>
  local_2b50;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_1L>
  local_2b40;
  undefined1 *local_2b38;
  code *local_2b30;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[17]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>
  local_2b28;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[17]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[21]>,_0L>_>,_2L>
  local_2b18;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[17]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[21]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_1L>_&>,_2L>
  local_2b08;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[17]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[21]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>_>,_2L>
  local_2af8;
  expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>
  local_2ae8;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_1L>
  local_2ad8;
  char local_2ac9;
  undefined1 *local_2ac8;
  code *local_2ac0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>
  local_2ab8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_2aa8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_1L>_&>,_2L>
  local_2a98;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>_>,_2L>
  local_2a88;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_2a78;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_2a70;
  karma_rule<fidler::ast::Method_()> *local_2a68;
  TypeDefinitionGrammar *local_2a60;
  undefined1 *local_2a58;
  code *local_2a50;
  char *local_2a48;
  undefined1 **local_2a40;
  char **local_2a38;
  char *local_2a30;
  undefined8 **local_2a28;
  TypeDefinitionGrammar **local_2a20;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<cxx::TypeDefinitionGrammar_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_2a18;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<cxx::TypeDefinitionGrammar_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_2a08;
  expr<_c6041ad5_> local_29f8;
  expr<_8ff6cde6_> local_29e8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[16]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_29d8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[16]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>
  local_29c8;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[16]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_1L>
  local_29b8;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_29b0;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<cxx::TypeDefinitionGrammar_&>,_1L>
  local_29a8;
  undefined1 *local_29a0;
  code *local_2998;
  char *local_2990;
  undefined1 **local_2988;
  char **local_2980;
  char *local_2978;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&>,_1L>
  local_2970;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<cxx::TypeDefinitionGrammar_&>,_1L>_&>,_2L>
  local_2968;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<cxx::TypeDefinitionGrammar_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_2958;
  expr<_690e7332_> local_2948;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_2938;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_2930;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_2928;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>
  local_2918;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_2908;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  local_28f8;
  allocator local_28e1;
  string local_28e0;
  allocator local_28b9;
  string local_28b8;
  allocator local_2891;
  string local_2890;
  allocator local_2869;
  string local_2868;
  allocator local_2841;
  string local_2840;
  allocator local_2819;
  string local_2818;
  allocator local_27f1;
  string local_27f0;
  allocator local_27b9;
  string local_27b8;
  ModelGrammar *local_2798;
  ModelGrammar *this_local;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_2788;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_2780;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_2778;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_2770;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_2760;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>
  *local_2758;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>
  *local_2750;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_2748;
  char *local_2738;
  proto_child0 local_2730;
  proto_child0 local_2728;
  char *local_2720;
  undefined1 *local_2710;
  char *local_2708;
  char *local_2700;
  undefined1 *local_26f8;
  karma_rule<fidler::ast::TypeCollection_()> *local_26e8;
  karma_rule<fidler::ast::TypeCollection_()> *local_26e0;
  karma_rule<fidler::ast::Interface_()> *local_26d0;
  karma_rule<fidler::ast::Interface_()> *local_26c8;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[16]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_1L>
  *local_26b8;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<cxx::TypeDefinitionGrammar_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_26b0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<cxx::TypeDefinitionGrammar_&>,_1L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>
  *local_26a8;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[16]>,_0L>,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&>,_1L>
  *local_26a0;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_2690;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<cxx::TypeDefinitionGrammar_&>,_1L>_&>,_2L>
  *local_2688;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>_>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>_>,_2L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<cxx::TypeDefinitionGrammar_&>,_1L>_&>,_2L>
  *local_2680;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  *local_2678;
  proto_child1 local_2668;
  proto_child0 local_2660;
  proto_child0 local_2658;
  proto_child1 local_2650;
  undefined8 **local_2640;
  undefined8 **local_2638;
  char *local_2628;
  char **local_2620;
  char **local_2618;
  char *local_2610;
  undefined1 **local_2600;
  char *local_25f8;
  char *local_25f0;
  undefined1 **local_25e8;
  undefined1 local_25d9;
  undefined1 *puStack_25d8;
  that_type that_53;
  undefined1 local_2599;
  undefined1 *puStack_2598;
  that_type that_41;
  undefined1 local_2559;
  undefined1 *puStack_2558;
  that_type that_25;
  undefined1 local_2519;
  undefined1 *puStack_2518;
  that_type that_8;
  expr_type that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>
  that_1;
  expr_type that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_3;
  expr_type that_4;
  expr_type that_5;
  expr_type that_6;
  expr_type that_7;
  undefined1 local_1bc1;
  code *local_1bc0;
  code *local_1bb8;
  undefined1 local_1ba9;
  code *local_1ba8;
  code *local_1ba0;
  undefined1 local_1b91;
  code *local_1b90;
  code *local_1b88;
  undefined1 local_1b79;
  code *local_1b78;
  code *local_1b70;
  undefined1 **local_1b68;
  undefined1 *local_1b60;
  undefined1 **local_1b58;
  undefined1 *local_1b50;
  undefined1 **local_1b48;
  undefined1 *local_1b40;
  undefined1 **local_1b38;
  undefined1 *local_1b30;
  code *local_1b28;
  undefined1 *local_1b20;
  code *local_1b18;
  code *local_1b10;
  undefined1 *local_1b08;
  code *local_1b00;
  code *local_1af8;
  undefined1 *local_1af0;
  code *local_1ae8;
  code *local_1ae0;
  undefined1 *local_1ad8;
  code *local_1ad0;
  code *local_1ac8;
  code *local_1ac0;
  code *local_1ab8;
  code *local_1ab0;
  code *local_1aa8;
  code *local_1aa0;
  code *local_1a98;
  code *local_1a90;
  undefined8 local_1a88;
  undefined8 local_1a80;
  code *local_1a78;
  code *local_1a70;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>
  that_54;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>
  that_42;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>
  that_26;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<void_(&)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_0L>
  that_9;
  expr_type that_10;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[11]>,_0L>
  that_11;
  expr_type that_12;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_13;
  expr_type that_14;
  expr_type that_15;
  expr_type that_31;
  expr_type that_16;
  expr_type that_17;
  expr_type that_37;
  expr_type that_18;
  expr_type that_19;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[16]>,_0L>
  that_20;
  expr_type that_21;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_22;
  expr_type that_23;
  expr_type that_24;
  expr_type that_27;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_28;
  expr_type that_29;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_30;
  expr_type that_32;
  expr_type that_33;
  expr_type that_34;
  expr_type that_35;
  expr_type that_36;
  expr_type that_38;
  expr_type that_39;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_40;
  expr_type that_43;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_44;
  expr_type that_45;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_46;
  expr_type that_47;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_48;
  expr_type that_59;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_60;
  expr_type that_49;
  expr_type that_61;
  expr_type that_50;
  expr_type that_51;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[5]>,_0L>
  that_52;
  expr_type that_55;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[17]>,_0L>
  that_56;
  expr_type that_57;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[21]>,_0L>
  that_58;
  expr_type that_62;
  expr_type that_63;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[15]>,_0L>
  that_64;
  expr_type that_65;
  expr_type that_69;
  expr_type that_78;
  expr_type that_66;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[13]>,_0L>
  that_67;
  expr_type that_68;
  expr_type that_70;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_71;
  expr_type that_72;
  expr_type that_73;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[9]>,_0L>
  that_74;
  expr_type that_75;
  expr_type that_76;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_77;
  expr_type that_79;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_80;
  expr_type that_81;
  expr_type that_82;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_83;
  expr_type that_84;
  expr_type that_85;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_86;
  expr_type that_87;
  expr_type that_88;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_89;
  
  local_2798 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_27b8,"unnamed-grammar",&local_27b9);
  boost::spirit::karma::
  grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->super_karma_grammar<ast::Model_()>,&this->model_,&local_27b8);
  std::__cxx11::string::~string((string *)&local_27b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_27b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_27f0,"unnamed-rule",&local_27f1);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->model_,&local_27f0);
  std::__cxx11::string::~string((string *)&local_27f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_27f1);
  TypeGrammar::TypeGrammar(&this->type_);
  TypeDefinitionGrammar::TypeDefinitionGrammar(&this->type_definition_);
  InitializerGrammar::InitializerGrammar(&this->initializer_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2818,"unnamed-rule",&local_2819);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->type_collection_,&local_2818);
  std::__cxx11::string::~string((string *)&local_2818);
  std::allocator<char>::~allocator((allocator<char> *)&local_2819);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2840,"unnamed-rule",&local_2841);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->interface_,&local_2840);
  std::__cxx11::string::~string((string *)&local_2840);
  std::allocator<char>::~allocator((allocator<char> *)&local_2841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2868,"unnamed-rule",&local_2869);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->method_,&local_2868);
  std::__cxx11::string::~string((string *)&local_2868);
  std::allocator<char>::~allocator((allocator<char> *)&local_2869);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2890,"unnamed-rule",&local_2891);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->broadcast_,&local_2890);
  std::__cxx11::string::~string((string *)&local_2890);
  std::allocator<char>::~allocator((allocator<char> *)&local_2891);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_28b8,"unnamed-rule",&local_28b9);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->argument_,&local_28b8);
  std::__cxx11::string::~string((string *)&local_28b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_28b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_28e0,"unnamed-rule",&local_28e1);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->constant_def_,&local_28e0);
  std::__cxx11::string::~string((string *)&local_28e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_28e1);
  local_2708 = "package: \'";
  local_2710 = &boost::spirit::standard::string;
  local_2928.child0.child0 = (proto_child0)0x147d3fb;
  local_2928.child1 = (proto_child1)&boost::spirit::standard::string;
  local_2918.child0 = &local_2928;
  local_2738 = "\'\n";
  local_2918.child1.child0 = (proto_child0)0x147d406;
  local_2930.child0 = &this->type_collection_;
  local_2908.child0 = &local_2918;
  local_2908.child1 = &local_2930;
  local_2938.child0 = &this->interface_;
  local_28f8.child0 = &local_2908;
  local_28f8.child1 = &local_2938;
  local_2788 = local_28f8.child1;
  local_2780 = local_28f8.child0;
  local_2778 = local_28f8.child0;
  local_2770 = local_28f8.child1;
  local_2760 = local_2908.child1;
  local_2758 = local_2908.child0;
  local_2750 = local_2908.child0;
  local_2748 = local_2908.child1;
  local_2730 = local_2918.child0;
  local_2728 = local_2918.child0;
  local_2720 = *local_2918.child1.child0;
  local_2700 = *local_2928.child0.child0;
  local_26f8 = local_2928.child1;
  local_26e8 = local_2930.child0;
  local_26e0 = local_2930.child0;
  local_26d0 = local_2938.child0;
  local_26c8 = local_2938.child0;
  boost::spirit::karma::operator%=(&this->model_,&local_28f8);
  that_8.child1.child0 = fidler::snake_case;
  puStack_2518 = &boost::spirit::standard::string;
  local_1bc0 = fidler::snake_case;
  local_1ad8 = &local_1bc1;
  local_1ae0 = fidler::snake_case;
  local_1ac8 = fidler::snake_case;
  local_1ac0 = fidler::snake_case;
  local_1ad0 = fidler::snake_case;
  local_1bb8 = fidler::snake_case;
  that_8.child0 = (proto_child0)fidler::snake_case;
  local_1b60 = &local_2519;
  local_1b68 = &puStack_2518;
  local_29a0 = &boost::spirit::standard::string;
  local_2998 = fidler::snake_case;
  local_25f8 = "namespace ";
  local_2988 = &local_29a0;
  local_2990 = "namespace ";
  local_2980 = &local_2990;
  local_2628 = "\n{\n";
  local_2978 = "\n{\n";
  local_2970.child0 = (proto_child0)&local_2980;
  local_29a8.child0 = &this->type_definition_;
  local_2968.child0 = &local_2970;
  local_2968.child1 = &local_29a8;
  local_29b0.child0 = &this->constant_def_;
  local_2958.child0 = &local_2968;
  local_2958.child1 = &local_29b0;
  local_29d8.child0.child0 = (proto_child0)0x147d409;
  local_29d8.child1 = (proto_child1)&boost::spirit::standard::string;
  local_29c8.child0 = &local_29d8;
  local_29c8.child1.child0 = (proto_child0)0x147d457;
  local_29b8.child0 = &local_29c8;
  local_2948.child0 = &local_2958;
  local_2948.child1 = &local_29b8;
  local_26b8 = local_2948.child1;
  local_26b0 = local_2948.child0;
  local_26a8 = local_2948.child0;
  local_26a0 = local_2948.child1;
  local_2690 = local_2958.child1;
  local_2688 = local_2958.child0;
  local_2680 = local_2958.child0;
  local_2678 = local_2958.child1;
  local_2668 = local_2968.child1;
  local_2660 = local_2968.child0;
  local_2658 = local_2968.child0;
  local_2650 = local_2968.child1;
  local_2640 = (undefined8 **)local_2970.child0;
  local_2638 = (undefined8 **)local_2970.child0;
  local_2620 = local_2980;
  local_2618 = local_2980;
  local_2610 = local_2978;
  local_2600 = local_2988;
  local_25f0 = local_2990;
  local_25e8 = local_2988;
  boost::spirit::karma::operator%=(&this->type_collection_,&local_2948);
  that_25.child1.child0 = fidler::pascal_case;
  puStack_2558 = &boost::spirit::standard::string;
  local_1ba8 = fidler::pascal_case;
  local_1af0 = &local_1ba9;
  local_1af8 = fidler::pascal_case;
  local_1ab8 = fidler::pascal_case;
  local_1ab0 = fidler::pascal_case;
  local_1ae8 = fidler::pascal_case;
  local_1ba0 = fidler::pascal_case;
  that_25.child0 = (proto_child0)fidler::pascal_case;
  local_1b50 = &local_2559;
  local_1b58 = &puStack_2558;
  local_2a58 = &boost::spirit::standard::string;
  local_2a50 = fidler::pascal_case;
  local_2a40 = &local_2a58;
  local_2a48 = "class ";
  local_2a38 = &local_2a48;
  local_2a30 = "\n{\n";
  local_2a60 = &this->type_definition_;
  local_2a28 = &local_2a38;
  local_2a20 = &local_2a60;
  local_2a68 = &this->method_;
  local_2a18.child0 = (proto_child0)&local_2a28;
  local_2a18.child1 = (proto_child1)&local_2a68;
  local_2a70.child0 = &this->broadcast_;
  local_2a08.child0 = &local_2a18;
  local_2a08.child1 = &local_2a70;
  local_2a78.child0 = &this->constant_def_;
  local_29f8.child0 = &local_2a08;
  local_29f8.child1 = &local_2a78;
  local_29e8.child0 = &local_29f8;
  local_29e8.child1.child0 = (proto_child0)0x147d419;
  boost::spirit::karma::operator%=(&this->interface_,&local_29e8);
  that_41.child1.child0 = fidler::snake_case;
  puStack_2598 = &boost::spirit::standard::string;
  local_1b90 = fidler::snake_case;
  local_1b08 = &local_1b91;
  local_1b10 = fidler::snake_case;
  local_1aa8 = fidler::snake_case;
  that_54.child0 = (proto_child0)0x0;
  local_1aa0 = fidler::snake_case;
  local_1b00 = fidler::snake_case;
  local_1b88 = fidler::snake_case;
  that_41.child0 = (proto_child0)fidler::snake_case;
  local_1b40 = &local_2599;
  local_1b48 = &puStack_2598;
  local_2ac8 = &boost::spirit::standard::string;
  local_2ac0 = fidler::snake_case;
  local_2ab8.child1 = (proto_child1)&local_2ac8;
  local_2ab8.child0.child0 = (proto_child0)0x147d41d;
  local_2ac9 = '(';
  local_2aa8.child0 = &local_2ab8;
  local_2aa8.child1.child0 = &local_2ac9;
  local_2ae8.child0 = &this->argument_;
  local_2ae8.child1.child0 = (proto_child0)0x1473c16;
  local_2ad8.child0 = &local_2ae8;
  local_2a98.child0 = &local_2aa8;
  local_2a98.child1 = &local_2ad8;
  local_2a88.child0 = &local_2a98;
  local_2a88.child1.child0 = (proto_child0)0x147d455;
  boost::spirit::karma::operator%=(&this->method_,&local_2a88);
  that_53.child1.child0 = fidler::snake_case;
  puStack_25d8 = &boost::spirit::standard::string;
  local_1b78 = fidler::snake_case;
  local_1b20 = &local_1b79;
  local_1b28 = fidler::snake_case;
  local_1a98 = fidler::snake_case;
  local_1a78 = fidler::snake_case;
  local_1a80 = 0;
  local_1a88 = 0;
  local_1a70 = fidler::snake_case;
  local_1a90 = fidler::snake_case;
  local_1b18 = fidler::snake_case;
  local_1b70 = fidler::snake_case;
  that_53.child0 = (proto_child0)fidler::snake_case;
  local_1b30 = &local_25d9;
  local_1b38 = &puStack_25d8;
  local_2b38 = &boost::spirit::standard::string;
  local_2b30 = fidler::snake_case;
  local_2b28.child1 = (proto_child1)&local_2b38;
  local_2b28.child0.child0 = (proto_child0)0x147d425;
  local_2b18.child0 = &local_2b28;
  local_2b18.child1.child0 = (proto_child0)0x147d436;
  local_2b50.child0 = &this->argument_;
  local_2b50.child1.child0 = (proto_child0)0x1473c16;
  local_2b40.child0 = &local_2b50;
  local_2b08.child0 = &local_2b18;
  local_2b08.child1 = &local_2b40;
  local_2af8.child0 = &local_2b08;
  local_2af8.child1.child0 = (proto_child0)0x147d44b;
  boost::spirit::karma::operator%=(&this->broadcast_,&local_2af8);
  local_2bab = (bool_<false>)0x1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_2baa,(bool *)&boost::spirit::bool_,&local_2bab);
  local_2ba8 = local_2baa;
  local_2ba0 = &local_2ba8;
  local_2b98 = "std::vector<";
  local_2b90.child1 = &this->type_;
  local_2b90.child0 = (proto_child0)&local_2ba0;
  local_2bcb = (bool_<false>)0x1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_2bca,(bool *)&boost::spirit::bool_,&local_2bcb);
  local_2bc8 = local_2bca;
  local_2bcc = 0x3e;
  local_2bc0.child0 = (proto_child0)&local_2bc8;
  local_2bc0.child1.child0 = &local_2bcc;
  local_2b80.child0 = &local_2b90;
  local_2b80.child1 = &local_2bc0;
  local_2b70.child0 = &local_2b80;
  local_2b70.child1.child0 = (proto_child0)0x147d45a;
  local_2b60.child0 = &local_2b70;
  local_2b60.child1 = (proto_child1)&boost::spirit::standard::string;
  boost::spirit::karma::operator%=(&this->argument_,&local_2b60);
  local_2c38 = &this->type_;
  local_2c40 = "const ";
  local_2c5b = (bool_<false>)0x1;
  boost::spirit::terminal<boost::spirit::tag::bool_>::operator()
            (local_2c5a,(bool *)&boost::spirit::bool_,&local_2c5b);
  local_2c58 = local_2c5a;
  local_2c50 = &local_2c58;
  local_2c48 = "[]";
  local_2c30 = &local_2c40;
  local_2c28 = &local_2c50;
  local_2c5c = 0x20;
  local_2c20 = &local_2c30;
  local_2c18 = &local_2c5c;
  local_2c10.child0 = (proto_child0)&local_2c20;
  local_2c10.child1 = (proto_child1)&boost::spirit::standard::string;
  local_2c00.child0 = &local_2c10;
  local_2c00.child1.child0 = (proto_child0)0x1473c91;
  local_2bf0.child1 = &this->initializer_;
  local_2bf0.child0 = &local_2c00;
  local_2be0.child0 = &local_2bf0;
  local_2be0.child1.child0 = (proto_child0)0x147d41a;
  boost::spirit::karma::operator%=(&this->constant_def_,&local_2be0);
  return;
}

Assistant:

ModelGrammar::ModelGrammar() :
		ModelGrammar::base_type(model_)
{
	namespace karma = boost::spirit::karma;

	model_
		%= "package: '"
		<< karma::string
		<< "'\n"
		<< *type_collection_
		<< *interface_
		;

	type_collection_
		%= -("namespace " << karma::string[fidler::snake_case] << "\n{\n")
		<< *type_definition_
		<< *constant_def_
		<< -("} // namespace " << karma::string << "\n\n")
		;

	interface_
		%= "class "
		<< karma::string[fidler::pascal_case]
		<< "\n{\n"
		<< *type_definition_
		<< *method_
		<< *broadcast_
		<< *constant_def_
		<< "};\n"
		;

	method_
		%= "  void "
		<< karma::string[fidler::snake_case]
		<< '('
		<< -(argument_ % ", ")
		<< ");\n\n"
		;

	broadcast_
		%= "  connection on_"
		<< karma::string[fidler::snake_case]
		<< "(std::function<void("
		<< -(argument_ % ", ")
		<< ")> handler);\n\n"
		;

	argument_
		%= (!karma::bool_(true) | "std::vector<")
		<< type_
		<< (!karma::bool_(true) | '>')
		<< " const& "
		<< karma::string
		;

	constant_def_
		%= "const "
		<< type_
		<< (!karma::bool_(true) | "[]")
		<< ' '
		<< karma::string
		<< " = "
		<< initializer_
		<< ";\n"
		;
}